

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::TypedArrayBase::GetPropertyQuery
          (TypedArrayBase *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  PropertyQueryFlags PVar6;
  BOOL BVar7;
  PropertyRecord *this_00;
  uint extraout_var;
  undefined4 *puVar8;
  RecyclableObject *this_01;
  Var aValue;
  
  this_00 = ScriptContext::GetPropertyName(requestContext,propertyId);
  if (this_00->isNumeric == true) {
    uVar4 = PropertyRecord::GetNumericValue(this_00);
    iVar5 = (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(this,(ulong)uVar4);
    aValue = (Var)CONCAT44(extraout_var,iVar5);
    *value = aValue;
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00bf4d34;
      *puVar8 = 0;
    }
    bVar3 = TaggedInt::Is(aValue);
    PVar6 = Property_Found;
    if (extraout_var >> 0x12 != 0 || bVar3) {
      return Property_Found;
    }
    this_01 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00bf4d34;
      *puVar8 = 0;
    }
    TVar1 = ((this_01->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      PVar6 = (PropertyQueryFlags)(TVar1 != TypeIds_Undefined);
    }
    else {
      BVar7 = RecyclableObject::IsExternal(this_01);
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00bf4d34:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
    }
  }
  else {
    if ((this_00->isSymbol != false) ||
       (BVar7 = CanonicalNumericIndexString(propertyId,requestContext), BVar7 == 0)) {
      PVar6 = DynamicObject::GetPropertyQuery
                        ((DynamicObject *)this,originalInstance,propertyId,value,info,requestContext
                        );
      return PVar6;
    }
    *value = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    PVar6 = Property_NotFound_NoProto;
  }
  return PVar6;
}

Assistant:

PropertyQueryFlags TypedArrayBase::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        const Js::PropertyRecord* propertyRecord = requestContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            *value = this->DirectGetItem(propertyRecord->GetNumericValue());
            if (JavascriptOperators::GetTypeId(*value) == Js::TypeIds_Undefined)
            {
                return PropertyQueryFlags::Property_NotFound;
            }
            return PropertyQueryFlags::Property_Found;
        }
        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, requestContext))
        {
            *value = requestContext->GetLibrary()->GetUndefined();
            return PropertyQueryFlags::Property_NotFound_NoProto;
        }

        return DynamicObject::GetPropertyQuery(originalInstance, propertyId, value, info, requestContext);
    }